

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManReadSignalList(Prs_Man_t *p,Vec_Int_t *vTemp,char LastSymb,int fAddForm)

{
  char cVar1;
  int Entry;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  vTemp->nSize = 0;
  Entry = Prs_ManReadSignal(p);
  do {
    if (Entry == 0) {
      if (p->ErrorStr[0] != '\0') {
LAB_003e087a:
        __assert_fail("!p->ErrorStr[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                      ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
      }
      builtin_strncpy(p->ErrorStr + 0x10,"al in the list.",0x10);
      uVar2._0_1_ = 'C';
      uVar2._1_1_ = 'a';
      uVar2._2_1_ = 'n';
      uVar2._3_1_ = 'n';
      uVar3._0_1_ = 'o';
      uVar3._1_1_ = 't';
      uVar3._2_1_ = ' ';
      uVar3._3_1_ = 'r';
      uVar4._0_1_ = 'e';
      uVar4._1_1_ = 'a';
      uVar4._2_1_ = 'd';
      uVar4._3_1_ = ' ';
      uVar5._0_1_ = 's';
      uVar5._1_1_ = 'i';
      uVar5._2_1_ = 'g';
      uVar5._3_1_ = 'n';
LAB_003e086c:
      *(undefined4 *)p->ErrorStr = uVar2;
      *(undefined4 *)(p->ErrorStr + 4) = uVar3;
      *(undefined4 *)(p->ErrorStr + 8) = uVar4;
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar5;
      return 0;
    }
    if (fAddForm != 0) {
      Vec_IntPush(vTemp,0);
    }
    Vec_IntPush(vTemp,Entry);
    cVar1 = *p->pCur;
    if (cVar1 == LastSymb) {
      return 1;
    }
    if (cVar1 != ',') {
      if (p->ErrorStr[0] != '\0') goto LAB_003e087a;
      builtin_strncpy(p->ErrorStr + 0xd,"ma in the list.",0x10);
      uVar2._0_1_ = 'E';
      uVar2._1_1_ = 'x';
      uVar2._2_1_ = 'p';
      uVar2._3_1_ = 'e';
      uVar3._0_1_ = 'c';
      uVar3._1_1_ = 't';
      uVar3._2_1_ = 'i';
      uVar3._3_1_ = 'n';
      uVar4._0_1_ = 'g';
      uVar4._1_1_ = ' ';
      uVar4._2_1_ = 'c';
      uVar4._3_1_ = 'o';
      uVar5._0_1_ = 'm';
      uVar5._1_1_ = 'm';
      uVar5._2_1_ = 'a';
      uVar5._3_1_ = ' ';
      goto LAB_003e086c;
    }
    p->pCur = p->pCur + 1;
    Entry = Prs_ManReadSignal(p);
  } while( true );
}

Assistant:

int Prs_ManReadSignalList( Prs_Man_t * p, Vec_Int_t * vTemp, char LastSymb, int fAddForm )
{
    Vec_IntClear( vTemp );
    while ( 1 )
    {
        int Item = Prs_ManReadSignal(p);
        if ( Item == 0 )                    return Prs_ManErrorSet(p, "Cannot read signal in the list.", 0);
        if ( fAddForm )
            Vec_IntPush( vTemp, 0 );
        Vec_IntPush( vTemp, Item );
        if ( Prs_ManIsChar(p, LastSymb) )   break;
        if ( !Prs_ManIsChar(p, ',') )       return Prs_ManErrorSet(p, "Expecting comma in the list.", 0);
        p->pCur++;
    }
    return 1;
}